

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

IceTSizeType
icetSparseImageBufferSizeType
          (IceTEnum color_format,IceTEnum depth_format,IceTSizeType width,IceTSizeType height)

{
  IceTSizeType IVar1;
  IceTSizeType IVar2;
  IceTSizeType IVar3;
  
  IVar1 = icetImageBufferSizeType(color_format,depth_format,width,height);
  IVar1 = IVar1 + 8;
  IVar2 = colorPixelSize(color_format);
  IVar3 = depthPixelSize(depth_format);
  if ((uint)(IVar3 + IVar2) < 8) {
    IVar1 = IVar1 + ((height * width + 1) / 2) * (8 - (IVar3 + IVar2));
  }
  return IVar1;
}

Assistant:

IceTSizeType icetSparseImageBufferSizeType(IceTEnum color_format,
                                           IceTEnum depth_format,
                                           IceTSizeType width,
                                           IceTSizeType height)
{
    IceTSizeType size;
    IceTSizeType pixel_size;

    /* A sparse image full of active pixels will be the same size as a full
       image plus a set of run lengths. */
    size = (  RUN_LENGTH_SIZE
            + icetImageBufferSizeType(color_format,depth_format,width,height) );

    /* For most common image formats, this is as large as the sparse image may
       be.  When the size of the run length pair is no bigger than the size of a
       pixel (the amount of data saved by writing the run lengths), then even in
       the pathological case of every other pixel being active.  However, it is
       possible that the run lengths take more space to store than the pixel
       data.  Thus, if there is an inactive run length of one, it is possible to
       have the data set a little bigger.  It is extremely unlikely to need this
       much memory, but we will have to allocate it just in case.  I suppose we
       could change the compress functions to not allow run lengths of size 1,
       but that could increase the time to compress and would definitely
       increase the complexity of the code. */
    pixel_size = colorPixelSize(color_format) + depthPixelSize(depth_format);
    if (pixel_size < RUN_LENGTH_SIZE) {
        size += (RUN_LENGTH_SIZE - pixel_size)*((width*height+1)/2);
    }
    return size;
}